

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_type_fracdigits(lysp_yang_ctx *ctx,lysp_type *type)

{
  char cVar1;
  ulong uVar2;
  LY_ERR LVar3;
  ushort **ppuVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  char *format;
  ly_ctx *plVar8;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  char *ptr;
  ly_stmt local_54;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  if (type->fraction_digits != '\0') {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","fraction-digits");
    return LY_EVALID;
  }
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_50,&local_40,&local_48);
  uVar2 = local_48;
  pcVar7 = local_50;
  if (LVar3 != LY_SUCCESS) goto LAB_0017ede8;
  if (((local_48 == 0) || (cVar1 = *local_50, (long)cVar1 == 0x30)) ||
     (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 8) == 0)) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Invalid value \"%.*s\" of \"%s\".";
    pcVar7 = local_50;
LAB_0017eddc:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,uVar2 & 0xffffffff,pcVar7,"fraction-digits");
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0;
    uVar6 = strtoull(pcVar7,&local_38,10);
    if ((long)local_38 - (long)pcVar7 != uVar2) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Invalid value \"%.*s\" of \"%s\".";
      goto LAB_0017eddc;
    }
    if (0x12 < uVar6 || *piVar5 == 0x22) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Value \"%.*s\" is out of \"%s\" bounds.";
      goto LAB_0017eddc;
    }
    type->fraction_digits = (uint8_t)uVar6;
    LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48);
    if ((LVar3 != LY_SUCCESS) || (LVar3 = LY_SUCCESS, local_54 == LY_STMT_SYNTAX_SEMICOLON))
    goto LAB_0017ede8;
    if (local_54 == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48);
      if ((LVar3 == LY_SUCCESS) && (LVar3 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
        do {
          if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar7 = lyplg_ext_stmt2str(local_54);
            ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,"fraction-digits");
            goto LAB_0017ede3;
          }
          LVar3 = parse_ext(ctx,local_50,local_48,type,LY_STMT_FRACTION_DIGITS,0,&type->exts);
        } while (((LVar3 == LY_SUCCESS) &&
                 (LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48), LVar3 == LY_SUCCESS)) &&
                (LVar3 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE));
      }
      goto LAB_0017ede8;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = lyplg_ext_stmt2str(local_54);
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar7);
  }
LAB_0017ede3:
  LVar3 = LY_EVALID;
LAB_0017ede8:
  free(local_40);
  return LVar3;
}

Assistant:

static LY_ERR
parse_type_fracdigits(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (type->fraction_digits) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "fraction-digits");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || (word[0] == '0') || !isdigit(word[0])) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    num = strtoull(word, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }
    if ((errno == ERANGE) || (num > LY_TYPE_DEC64_FD_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }
    type->fraction_digits = num;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, type, LY_STMT_FRACTION_DIGITS, 0, &type->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "fraction-digits");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}